

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall json::JSON::~JSON(JSON *this)

{
  int iVar1;
  void *pvVar2;
  string *this_00;
  undefined8 *in_RDI;
  deque<json::JSON,_std::allocator<json::JSON>_> *in_stack_00000020;
  
  iVar1 = *(int *)(in_RDI + 1);
  if (iVar1 == 1) {
    pvVar2 = (void *)*in_RDI;
    if (pvVar2 != (void *)0x0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>_>_>
              *)0x43a285);
      operator_delete(pvVar2,0x30);
    }
  }
  else if (iVar1 == 2) {
    pvVar2 = (void *)*in_RDI;
    if (pvVar2 != (void *)0x0) {
      std::deque<json::JSON,_std::allocator<json::JSON>_>::~deque(in_stack_00000020);
      operator_delete(pvVar2,0x50);
    }
  }
  else if ((iVar1 == 3) && (this_00 = (string *)*in_RDI, this_00 != (string *)0x0)) {
    std::__cxx11::string::~string(this_00);
    operator_delete(this_00,0x20);
  }
  return;
}

Assistant:

~JSON() {
            switch( Type ) {
            case Class::Array:
                delete Internal.List;
                break;
            case Class::Object:
                delete Internal.Map;
                break;
            case Class::String:
                delete Internal.String;
                break;
            default:;
            }
        }